

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_math.hpp
# Opt level: O0

double __thiscall
trng::int_math::power<2147462579,_1616076847>::pow
          (power<2147462579,_1616076847> *this,double __x,double __y)

{
  uint in_ESI;
  double extraout_XMM0_Qa;
  int64_t t;
  int64_t p;
  undefined4 local_c;
  
  for (local_c = in_ESI; 0 < (int)local_c; local_c = (int)local_c / 2) {
    if ((local_c & 1) == 1) {
      modulo<2147462579,1>(0x45fa62);
    }
    modulo<2147462579,1>(0x45fa79);
    __x = extraout_XMM0_Qa;
  }
  return __x;
}

Assistant:

int32_t pow(int32_t n) {
        int64_t p{1}, t{b};
        while (n > 0) {
          if ((n & 0x1) == 0x1)
            p = modulo<m, 1>(p * t);
          t = modulo<m, 1>(t * t);
          n /= 2;
        }
        return static_cast<int32_t>(p);
      }